

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

bool __thiscall
Rml::DataInterpreter::Execute
          (DataInterpreter *this,Instruction instruction,Variant *data,size_t *next_instruction)

{
  Vector<Variant> *this_00;
  pointer pvVar1;
  pointer pVVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  unsigned_long uVar10;
  char *pcVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ulong uVar13;
  double dVar14;
  double dVar15;
  String function_name;
  String arguments_str;
  DataAddress address;
  Vector<Variant> arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(instruction) {
  case Less:
    dVar14 = Variant::Get<double>(&this->L,0.0);
    dVar15 = Variant::Get<double>(&this->R,0.0);
    bVar4 = dVar15 == dVar14;
    bVar5 = dVar15 < dVar14;
    goto LAB_002630b9;
  case Equal:
    if (((this->L).type != STRING) && ((this->R).type != STRING)) {
      dVar14 = Variant::Get<double>(&this->L,0.0);
      dVar15 = Variant::Get<double>(&this->R,0.0);
      bVar4 = dVar14 == dVar15;
LAB_00263136:
      arguments_str._M_dataplus._M_p._0_1_ = bVar4;
      goto LAB_002632bd;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>(&arguments_str,&this->L,&local_d0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address,
               &this->R,&local_f0);
    _Var6 = ::std::operator==(&arguments_str,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &address);
    arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,_Var6);
    Variant::Variant<bool,void>((Variant *)&function_name,(bool *)&arguments);
    Variant::operator=(&this->R,(Variant *)&function_name);
    Variant::~Variant((Variant *)&function_name);
    ::std::__cxx11::string::~string((string *)&address);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&arguments_str);
    this_01 = &local_d0;
    goto LAB_00263780;
  case Greater:
    dVar14 = Variant::Get<double>(&this->L,0.0);
    dVar15 = Variant::Get<double>(&this->R,0.0);
    bVar4 = dVar14 == dVar15;
    bVar5 = dVar14 < dVar15;
LAB_002630b9:
    arguments_str._M_dataplus._M_p._0_1_ = !bVar5 && !bVar4;
LAB_002632bd:
    Variant::Variant<bool,void>((Variant *)&function_name,(bool *)&arguments_str);
LAB_00263309:
    Variant::operator=(&this->R,(Variant *)&function_name);
    Variant::~Variant((Variant *)&function_name);
    break;
  case 0x3f:
  case 0x40:
  case 0x42:
  case 0x43:
  case 0x46:
  case 0x48:
  case 0x4b:
  case 0x4d:
  case 0x4f:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x55:
  case 0x57:
  case 0x58:
switchD_00262db8_caseD_3f:
    bVar4 = Assert("Instruction not implemented.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                   ,0x465);
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    break;
  case Assign:
    iVar8 = Variant::Get<int>(data,-1);
    pvVar1 = (this->addresses->
             super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)iVar8 <
        (ulong)(((long)(this->addresses->
                       super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18)) {
      bVar4 = DataExpressionInterface::SetValue(&this->expression_interface,pvVar1 + iVar8,&this->R)
      ;
      if (bVar4) break;
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&function_name,"Could not assign to variable.",
                 (allocator<char> *)&arguments_str);
      bVar7 = Error(this,&function_name);
    }
    else {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&function_name,"Variable address not found.",
                 (allocator<char> *)&arguments_str);
      bVar7 = Error(this,&function_name);
    }
LAB_00263845:
    ::std::__cxx11::string::~string((string *)&function_name);
    goto LAB_0026331f;
  case Literal:
    Variant::operator=(&this->R,data);
    break;
  case EventFnc:
  case TransformFnc:
    arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = ExtractArgumentsFromStack(this,&arguments);
    if (bVar4) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      Variant::Get<std::__cxx11::string>(&function_name,data,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      if (instruction == TransformFnc) {
        bVar4 = DataExpressionInterface::CallTransform
                          (&this->expression_interface,&function_name,&arguments,&this->R);
      }
      else {
        bVar4 = DataExpressionInterface::EventCallback
                          (&this->expression_interface,&function_name,&arguments);
      }
      if (bVar4 == false) {
        arguments_str._M_dataplus._M_p = (pointer)&arguments_str.field_2;
        arguments_str._M_string_length = 0;
        arguments_str.field_2._M_local_buf[0] = '\0';
        lVar12 = 0;
        for (uVar13 = 0;
            uVar13 < (ulong)(((long)arguments.
                                    super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)arguments.
                                   super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                                   _M_impl.super__Vector_impl_data._M_start) / 0x28);
            uVar13 = uVar13 + 1) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          local_150._M_string_length = 0;
          local_150.field_2._M_local_buf[0] = '\0';
          Variant::Get<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address,
                     (Variant *)
                     ((arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                       _M_impl.super__Vector_impl_data._M_start)->data + lVar12 + -8),&local_150);
          ::std::__cxx11::string::append((string *)&arguments_str);
          ::std::__cxx11::string::~string((string *)&address);
          ::std::__cxx11::string::~string((string *)&local_150);
          if (uVar13 < ((long)arguments.
                              super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)arguments.
                             super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl
                             .super__Vector_impl_data._M_start) / 0x28 - 1U) {
            ::std::__cxx11::string::append((char *)&arguments_str);
          }
          lVar12 = lVar12 + 0x28;
        }
        pcVar11 = "event callback";
        if (instruction == TransformFnc) {
          pcVar11 = "transform function";
        }
        CreateString_abi_cxx11_
                  ((String *)&address,"Failed to execute %s: %s(%s)",pcVar11,
                   CONCAT44(function_name._M_dataplus._M_p._4_4_,(int)function_name._M_dataplus._M_p
                           ),arguments_str._M_dataplus._M_p);
        bVar5 = Error(this,(String *)&address);
        data = (Variant *)(ulong)bVar5;
        ::std::__cxx11::string::~string((string *)&address);
        ::std::__cxx11::string::~string((string *)&arguments_str);
      }
      bVar7 = (byte)data;
      ::std::__cxx11::string::~string((string *)&function_name);
    }
    else {
      bVar4 = false;
      bVar7 = 0;
    }
    ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::~vector(&arguments);
    if (bVar4 == false) goto LAB_0026331f;
    break;
  case GreaterEq:
    dVar14 = Variant::Get<double>(&this->L,0.0);
    dVar15 = Variant::Get<double>(&this->R,0.0);
    bVar4 = dVar14 < dVar15;
    goto LAB_00263165;
  case CastToInt:
    bVar4 = Variant::GetInto<int,_0>(&this->R,(int *)&arguments_str);
    if (!bVar4) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&function_name,"Could not cast value to int.",(allocator<char> *)&address
                );
      bVar7 = Error(this,&function_name);
      goto LAB_00263845;
    }
    Variant::operator=(&this->R,(int *)&arguments_str);
    break;
  case Jump:
switchD_00262db8_caseD_4a:
    uVar10 = Variant::Get<unsigned_long>(data,0);
    *next_instruction = uVar10;
    break;
  case LessEq:
    dVar14 = Variant::Get<double>(&this->L,0.0);
    dVar15 = Variant::Get<double>(&this->R,0.0);
    bVar4 = dVar15 < dVar14;
LAB_00263165:
    arguments_str._M_dataplus._M_p._0_1_ = !bVar4;
    goto LAB_002632bd;
  case NotEqual:
    if (((this->L).type != STRING) && ((this->R).type != STRING)) {
      dVar14 = Variant::Get<double>(&this->L,0.0);
      dVar15 = Variant::Get<double>(&this->R,0.0);
      bVar4 = dVar14 != dVar15;
      goto LAB_00263136;
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>(&arguments_str,&this->L,&local_110);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address,
               &this->R,&local_130);
    bVar4 = ::std::operator!=(&arguments_str,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &address);
    arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(arguments.super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    Variant::Variant<bool,void>((Variant *)&function_name,(bool *)&arguments);
    Variant::operator=(&this->R,(Variant *)&function_name);
    Variant::~Variant((Variant *)&function_name);
    ::std::__cxx11::string::~string((string *)&address);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&arguments_str);
    this_01 = &local_110;
LAB_00263780:
    ::std::__cxx11::string::~string((string *)this_01);
    break;
  case Push:
    ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::emplace_back<Rml::Variant>
              (&this->stack,&this->R);
    Variant::Clear(&this->R);
    break;
  case Variable:
    iVar8 = Variant::Get<int>(data,-1);
    pvVar1 = (this->addresses->
             super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->addresses->
                       super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <=
        (ulong)(long)iVar8) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&function_name,"Variable address not found.",
                 (allocator<char> *)&arguments_str);
      bVar7 = Error(this,&function_name);
      goto LAB_00263845;
    }
    DataExpressionInterface::GetValue
              ((Variant *)&function_name,&this->expression_interface,pvVar1 + iVar8);
    goto LAB_00263309;
  case DynamicVariable:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>(&arguments_str,&this->R,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    DataExpressionInterface::ParseAddress(&address,&this->expression_interface,&arguments_str);
    if (address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&function_name,"Variable address not found.",
                 (allocator<char> *)&arguments);
      bVar4 = Error(this,&function_name);
      this = (DataInterpreter *)(ulong)bVar4;
      ::std::__cxx11::string::~string((string *)&function_name);
    }
    else {
      DataExpressionInterface::GetValue
                ((Variant *)&function_name,&this->expression_interface,&address);
      Variant::operator=(&this->R,(Variant *)&function_name);
      Variant::~Variant((Variant *)&function_name);
    }
    bVar7 = (byte)this;
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&address);
    ::std::__cxx11::string::~string((string *)&arguments_str);
    if (address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_0026331f;
    break;
  case JumpIfZero:
    bVar4 = Variant::Get<bool>(&this->R,false);
    if (!bVar4) goto switchD_00262db8_caseD_4a;
    break;
  default:
    switch(instruction) {
    case Not:
      bVar5 = Variant::Get<bool>(&this->R,false);
      bVar5 = !bVar5;
LAB_00262e91:
      arguments_str._M_dataplus._M_p._0_1_ = bVar5;
      goto LAB_002632bd;
    case 0x22:
    case 0x24:
    case 0x25:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
      goto switchD_00262db8_caseD_3f;
    case NumArguments:
      function_name._M_dataplus._M_p._0_4_ = Variant::Get<int>(data,-1);
      Variant::operator=(&this->R,(int *)&function_name);
      goto LAB_0026331c;
    case And:
      bVar5 = false;
      bVar4 = Variant::Get<bool>(&this->L,false);
      if (bVar4) {
        bVar5 = Variant::Get<bool>(&this->R,false);
      }
      arguments_str._M_dataplus._M_p._0_1_ = bVar5;
      goto LAB_002632bd;
    case Multiply:
      dVar14 = Variant::Get<double>(&this->L,0.0);
      dVar15 = Variant::Get<double>(&this->R,0.0);
      arguments_str._M_dataplus._M_p = (pointer)(dVar15 * dVar14);
      break;
    case Add:
      if (((this->L).type == STRING) || ((this->R).type == STRING)) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        Variant::Get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&address,
                   &this->L,&local_90);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        Variant::Get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments,
                   &this->R,&local_b0);
        ::std::operator+(&arguments_str,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &address,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&arguments);
        Variant::Variant<std::__cxx11::string,void>((Variant *)&function_name,&arguments_str);
        Variant::operator=(&this->R,(Variant *)&function_name);
        Variant::~Variant((Variant *)&function_name);
        ::std::__cxx11::string::~string((string *)&arguments_str);
        ::std::__cxx11::string::~string((string *)&arguments);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&address);
        this_01 = &local_90;
        goto LAB_00263780;
      }
      dVar14 = Variant::Get<double>(&this->L,0.0);
      dVar15 = Variant::Get<double>(&this->R,0.0);
      arguments_str._M_dataplus._M_p = (pointer)(dVar15 + dVar14);
      break;
    case Subtract:
      dVar14 = Variant::Get<double>(&this->L,0.0);
      dVar15 = Variant::Get<double>(&this->R,0.0);
      arguments_str._M_dataplus._M_p = (pointer)(dVar14 - dVar15);
      break;
    case Divide:
      dVar14 = Variant::Get<double>(&this->L,0.0);
      dVar15 = Variant::Get<double>(&this->R,0.0);
      arguments_str._M_dataplus._M_p = (pointer)(dVar14 / dVar15);
      break;
    default:
      if (instruction != Pop) {
        if (instruction == Or) {
          bVar4 = Variant::Get<bool>(&this->L,false);
          bVar5 = true;
          if (!bVar4) {
            bVar5 = Variant::Get<bool>(&this->R,false);
          }
          goto LAB_00262e91;
        }
        goto switchD_00262db8_caseD_3f;
      }
      if ((this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&function_name,"Cannot pop stack, it is empty.",
                   (allocator<char> *)&arguments_str);
        bVar7 = Error(this,&function_name);
        goto LAB_00263845;
      }
      this_00 = &this->stack;
      uVar9 = Variant::Get<int>(data,-1);
      if (uVar9 == 1) {
        pVVar2 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        this = (DataInterpreter *)&this->L;
      }
      else {
        if (uVar9 != 0) {
          CreateString_abi_cxx11_(&function_name,"Invalid register %d.",(ulong)uVar9);
          bVar7 = Error(this,&function_name);
          goto LAB_00263845;
        }
        pVVar2 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      Variant::operator=(&this->R,pVVar2 + -1);
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::pop_back(this_00);
      goto LAB_0026331c;
    }
    Variant::Variant<double,void>((Variant *)&function_name,(double *)&arguments_str);
    goto LAB_00263309;
  }
LAB_0026331c:
  bVar7 = 1;
LAB_0026331f:
  return (bool)(bVar7 & 1);
}

Assistant:

bool Execute(const Instruction instruction, const Variant& data, size_t& next_instruction)
	{
		auto AnyString = [](const Variant& v1, const Variant& v2) { return v1.GetType() == Variant::STRING || v2.GetType() == Variant::STRING; };

		switch (instruction)
		{
		case Instruction::Push:
		{
			stack.push_back(std::move(R));
			R.Clear();
		}
		break;
		case Instruction::Pop:
		{
			if (stack.empty())
				return Error("Cannot pop stack, it is empty.");

			Register reg = Register(data.Get<int>(-1));
			switch (reg)
			{
				// clang-format off
			case Register::R:  R = stack.back(); stack.pop_back(); break;
			case Register::L:  L = stack.back(); stack.pop_back(); break;
				// clang-format on
			default: return Error(CreateString("Invalid register %d.", int(reg)));
			}
		}
		break;
		case Instruction::Literal:
		{
			R = data;
		}
		break;
		case Instruction::DynamicVariable:
		{
			auto str = R.Get<String>();
			auto address = expression_interface.ParseAddress(str);
			if (address.empty())
				return Error("Variable address not found.");
			R = expression_interface.GetValue(address);
		}
		break;
		case Instruction::Variable:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
				R = expression_interface.GetValue(addresses[variable_index]);
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::Add:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() + R.Get<String>());
			else
				R = Variant(L.Get<double>() + R.Get<double>());
		}
		break;
			// clang-format off
		case Instruction::Subtract:  R = Variant(L.Get<double>() - R.Get<double>());  break;
		case Instruction::Multiply:  R = Variant(L.Get<double>() * R.Get<double>());  break;
		case Instruction::Divide:    R = Variant(L.Get<double>() / R.Get<double>());  break;
		case Instruction::Not:       R = Variant(!R.Get<bool>());                     break;
		case Instruction::And:       R = Variant(L.Get<bool>() && R.Get<bool>());     break;
		case Instruction::Or:        R = Variant(L.Get<bool>() || R.Get<bool>());     break;
		case Instruction::Less:      R = Variant(L.Get<double>() < R.Get<double>());  break;
		case Instruction::LessEq:    R = Variant(L.Get<double>() <= R.Get<double>()); break;
		case Instruction::Greater:   R = Variant(L.Get<double>() > R.Get<double>());  break;
		case Instruction::GreaterEq: R = Variant(L.Get<double>() >= R.Get<double>()); break;
			// clang-format on
		case Instruction::Equal:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() == R.Get<String>());
			else
				R = Variant(L.Get<double>() == R.Get<double>());
		}
		break;
		case Instruction::NotEqual:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() != R.Get<String>());
			else
				R = Variant(L.Get<double>() != R.Get<double>());
		}
		break;
		case Instruction::NumArguments:
		{
			const int num_arguments = data.Get<int>(-1);
			R = num_arguments;
		}
		break;
		case Instruction::TransformFnc:
		case Instruction::EventFnc:
		{
			Vector<Variant> arguments;
			if (!ExtractArgumentsFromStack(arguments))
				return false;

			const String function_name = data.Get<String>();
			const bool result = (instruction == Instruction::TransformFnc ? expression_interface.CallTransform(function_name, arguments, R)
																		  : expression_interface.EventCallback(function_name, arguments));
			if (!result)
			{
				String arguments_str;
				for (size_t i = 0; i < arguments.size(); i++)
				{
					arguments_str += arguments[i].Get<String>();
					if (i < arguments.size() - 1)
						arguments_str += ", ";
				}
				return Error(
					CreateString("Failed to execute %s: %s(%s)", instruction == Instruction::TransformFnc ? "transform function" : "event callback",
						function_name.c_str(), arguments_str.c_str()));
			}
		}
		break;
		case Instruction::Assign:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
			{
				if (!expression_interface.SetValue(addresses[variable_index], R))
					return Error("Could not assign to variable.");
			}
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::CastToInt:
		{
			int tmp;
			if (!R.GetInto(tmp))
				return Error("Could not cast value to int.");
			else
				R = tmp;
		}
		break;
		case Instruction::JumpIfZero:
		{
			if (!R.Get<bool>())
				next_instruction = data.Get<size_t>(0);
		}
		break;
		case Instruction::Jump:
		{
			next_instruction = data.Get<size_t>(0);
		}
		break;
		default: RMLUI_ERRORMSG("Instruction not implemented."); break;
		}
		return true;
	}